

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# q3.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string str;
  
  str.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,"this is a string",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68," ",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"%20",&local_91);
  replace((string *)local_30,&local_68,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_30);
  std::operator<<(poVar1,'\n');
  str.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)local_30);
  return str.field_2._12_4_;
}

Assistant:

int main(){
  std::string str {"this is a string"};

  replace(str, " ", "%20");

  std::cout << str << '\n';
  
  return 0;
}